

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O0

void __thiscall f8n::prefs::Preferences::SetBool(Preferences *this,char *key,bool value)

{
  allocator<char> local_41;
  string local_40 [39];
  byte local_19;
  char *pcStack_18;
  bool value_local;
  char *key_local;
  Preferences *this_local;
  
  local_19 = value;
  pcStack_18 = key;
  key_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,key,&local_41);
  (*(this->super_IPreferences)._vptr_IPreferences[0xe])(this,local_40,(ulong)(local_19 & 1));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void Preferences::SetBool(const char* key, bool value) {
    this->SetBool(std::string(key), value);
}